

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

uint16_t phys_section_add(uc_struct_conflict15 *uc,PhysPageMap *map,MemoryRegionSection *section)

{
  undefined8 *puVar1;
  uc_arch uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Node *paPVar5;
  MemoryRegionSection *pMVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  MemoryRegionSection *pMVar9;
  FlatView *pFVar10;
  long lVar11;
  gsize n_blocks;
  
  if (uc->arch < 0x4000) {
    uVar2 = uc->mode;
    if (uc->arch == uVar2) {
      n_blocks = 0x10;
      if (UC_ARCH_RISCV < uVar2) {
        n_blocks = (gsize)(uVar2 * 2);
      }
      uc->mode = (uc_mode)n_blocks;
      pFVar10 = (FlatView *)g_realloc_n((uc->address_space_memory).current_map,n_blocks,0x40);
      (uc->address_space_memory).current_map = pFVar10;
    }
    pFVar10 = (uc->address_space_memory).current_map;
    lVar11 = (ulong)uc->arch * 0x40;
    uVar3 = *(undefined8 *)map;
    uVar4 = *(undefined8 *)&map->nodes_nb;
    paPVar5 = map->nodes;
    pMVar6 = map->sections;
    uVar7 = *(undefined8 *)(map + 1);
    uVar8 = *(undefined8 *)&map[1].nodes_nb;
    pMVar9 = map[1].sections;
    puVar1 = (undefined8 *)((long)pFVar10 + lVar11 + 0x30);
    *puVar1 = map[1].nodes;
    puVar1[1] = pMVar9;
    puVar1 = (undefined8 *)((long)pFVar10 + lVar11 + 0x20);
    *puVar1 = uVar7;
    puVar1[1] = uVar8;
    puVar1 = (undefined8 *)((long)pFVar10 + lVar11 + 0x10);
    *puVar1 = paPVar5;
    puVar1[1] = pMVar6;
    *(undefined8 *)((long)pFVar10 + lVar11) = uVar3;
    ((undefined8 *)((long)pFVar10 + lVar11))[1] = uVar4;
    uVar2 = uc->arch;
    uc->arch = uVar2 + UC_ARCH_ARM;
    return (uint16_t)uVar2;
  }
  __assert_fail("map->sections_nb < TARGET_PAGE_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x345,
                "uint16_t phys_section_add(struct uc_struct *, PhysPageMap *, MemoryRegionSection *)"
               );
}

Assistant:

static uint16_t phys_section_add(struct uc_struct *uc, PhysPageMap *map,
                                 MemoryRegionSection *section)
{
    /* The physical section number is ORed with a page-aligned
     * pointer to produce the iotlb entries.  Thus it should
     * never overflow into the page-aligned value.
     */
    assert(map->sections_nb < TARGET_PAGE_SIZE);

    if (map->sections_nb == map->sections_nb_alloc) {
        map->sections_nb_alloc = MAX(map->sections_nb_alloc * 2, 16);
        map->sections = g_renew(MemoryRegionSection, map->sections,
                                map->sections_nb_alloc);
    }
    map->sections[map->sections_nb] = *section;
    return map->sections_nb++;
}